

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void __thiscall VmFunction::MoveEntryBlockToStart(VmFunction *this)

{
  VmBlock **ppVVar1;
  uint uVar2;
  VmBlock *pVVar3;
  VmBlock *curr;
  VmBlock *pVVar4;
  VmBlock *pVVar5;
  long lVar6;
  VmBlock *block;
  
  pVVar3 = this->firstBlock;
  pVVar4 = pVVar3;
  if (pVVar3 != (VmBlock *)0x0) {
    do {
      uVar2 = (pVVar4->super_VmValue).users.count;
      if (uVar2 != 0) {
        lVar6 = 0;
        do {
          block = pVVar4;
          if ((VmFunction *)(pVVar4->super_VmValue).users.data[lVar6] == this) goto LAB_001aac9b;
          lVar6 = lVar6 + 1;
        } while (uVar2 != (uint)lVar6);
      }
      block = (VmBlock *)0x0;
LAB_001aac9b:
      if (block != (VmBlock *)0x0) goto LAB_001aacaf;
      ppVVar1 = &pVVar4->nextSibling;
      pVVar4 = *ppVVar1;
    } while (*ppVVar1 != (VmBlock *)0x0);
    block = (VmBlock *)0x0;
LAB_001aacaf:
    if (block == (VmBlock *)0x0) {
      __assert_fail("entryBlock",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x86b,"void VmFunction::MoveEntryBlockToStart()");
    }
    if (pVVar3 != block) {
      DetachBlock(this,block);
      pVVar3 = this->firstBlock;
      pVVar4 = (VmBlock *)this;
      pVVar5 = block;
      if (pVVar3 != (VmBlock *)0x0) {
        pVVar3->prevSibling = block;
        pVVar4 = block;
        pVVar5 = pVVar3;
      }
      pVVar4->nextSibling = pVVar5;
      this->firstBlock = block;
      block->parent = this;
    }
  }
  return;
}

Assistant:

void VmFunction::MoveEntryBlockToStart()
{
	if(!firstBlock)
		return;

	// Function must start from the first block
	VmBlock *entryBlock = NULL;

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			if(curr->users[i] == this)
			{
				entryBlock = curr;
				break;
			}
		}

		if(entryBlock)
			break;
	}

	assert(entryBlock);

	if(firstBlock != entryBlock)
	{
		// Detach entry block
		DetachBlock(entryBlock);

		// Re-attach to front
		if(!firstBlock)
		{
			firstBlock = lastBlock = entryBlock;
		}
		else
		{
			firstBlock->prevSibling = entryBlock;
			entryBlock->nextSibling = firstBlock;
			firstBlock = entryBlock;
		}

		entryBlock->parent = this;
	}
}